

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O0

int Saig_ManFramesCount_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(p,pObj);
      pAVar3 = Aig_ObjFanin0(pObj);
      iVar1 = Saig_ManFramesCount_rec(p,pAVar3);
      pAVar3 = Aig_ObjFanin1(pObj);
      iVar2 = Saig_ManFramesCount_rec(p,pAVar3);
      p_local._4_4_ = iVar1 + 1 + iVar2;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManFramesCount_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( !Aig_ObjIsNode(pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Aig_ObjSetTravIdCurrent(p, pObj);
    return 1 + Saig_ManFramesCount_rec( p, Aig_ObjFanin0(pObj) ) + 
        Saig_ManFramesCount_rec( p, Aig_ObjFanin1(pObj) );
}